

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void al_set_blend_color(ALLEGRO_COLOR color)

{
  long *plVar1;
  long lVar2;
  float local_28;
  float fStack_24;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) {
      return;
    }
  }
  local_28 = color.r;
  fStack_24 = color.g;
  *(float *)(lVar2 + 0xf8) = local_28;
  *(float *)(lVar2 + 0xfc) = fStack_24;
  *(float *)(lVar2 + 0x100) = color.b;
  *(float *)(lVar2 + 0x104) = color.a;
  return;
}

Assistant:

void al_set_blend_color(ALLEGRO_COLOR color)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   tls->current_blender.blend_color = color;
}